

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O2

int nn_sws_recv_hdr(nn_sws *self)

{
  int iVar1;
  int extraout_EAX;
  
  if (self->continuing == 0) {
    iVar1 = nn_list_empty(&self->inmsg_array);
    if (iVar1 == 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_list_empty (&self->inmsg_array)",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x15f);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined8 *)((long)&self->inmsg_current_chunk_len + 4) = 0;
    *(undefined8 *)((long)&self->inmsg_total_size + 4) = 0;
    self->inmsg_current_chunk_buf = (uint8_t *)0x0;
    self->inmsg_current_chunk_len = 0;
  }
  self->inmsg_control[0x6d] = '\0';
  self->inmsg_control[0x6e] = '\0';
  self->inmsg_control[0x6f] = '\0';
  self->inmsg_control[0x70] = '\0';
  self->inmsg_control[0x71] = '\0';
  self->inmsg_control[0x72] = '\0';
  self->inmsg_control[0x73] = '\0';
  self->inmsg_control[0x74] = '\0';
  self->inmsg_control[0x75] = '\0';
  self->inmsg_control[0x76] = '\0';
  self->inmsg_control[0x77] = '\0';
  self->inmsg_control[0x78] = '\0';
  self->inmsg_control[0x79] = '\0';
  self->inmsg_control[0x7a] = '\0';
  self->inmsg_control[0x7b] = '\0';
  self->inmsg_control[0x7c] = '\0';
  self->inmsg_control[0x60] = '\0';
  self->inmsg_control[0x61] = '\0';
  self->inmsg_control[0x62] = '\0';
  self->inmsg_control[99] = '\0';
  self->inmsg_control[100] = '\0';
  self->inmsg_control[0x65] = '\0';
  self->inmsg_control[0x66] = '\0';
  self->inmsg_control[0x67] = '\0';
  self->inmsg_control[0x68] = '\0';
  self->inmsg_control[0x69] = '\0';
  self->inmsg_control[0x6a] = '\0';
  self->inmsg_control[0x6b] = '\0';
  self->inmsg_control[0x6c] = '\0';
  self->inmsg_control[0x6d] = '\0';
  self->inmsg_control[0x6e] = '\0';
  self->inmsg_control[0x6f] = '\0';
  self->inmsg_control[0x50] = '\0';
  self->inmsg_control[0x51] = '\0';
  self->inmsg_control[0x52] = '\0';
  self->inmsg_control[0x53] = '\0';
  self->inmsg_control[0x54] = '\0';
  self->inmsg_control[0x55] = '\0';
  self->inmsg_control[0x56] = '\0';
  self->inmsg_control[0x57] = '\0';
  self->inmsg_control[0x58] = '\0';
  self->inmsg_control[0x59] = '\0';
  self->inmsg_control[0x5a] = '\0';
  self->inmsg_control[0x5b] = '\0';
  self->inmsg_control[0x5c] = '\0';
  self->inmsg_control[0x5d] = '\0';
  self->inmsg_control[0x5e] = '\0';
  self->inmsg_control[0x5f] = '\0';
  self->inmsg_control[0x40] = '\0';
  self->inmsg_control[0x41] = '\0';
  self->inmsg_control[0x42] = '\0';
  self->inmsg_control[0x43] = '\0';
  self->inmsg_control[0x44] = '\0';
  self->inmsg_control[0x45] = '\0';
  self->inmsg_control[0x46] = '\0';
  self->inmsg_control[0x47] = '\0';
  self->inmsg_control[0x48] = '\0';
  self->inmsg_control[0x49] = '\0';
  self->inmsg_control[0x4a] = '\0';
  self->inmsg_control[0x4b] = '\0';
  self->inmsg_control[0x4c] = '\0';
  self->inmsg_control[0x4d] = '\0';
  self->inmsg_control[0x4e] = '\0';
  self->inmsg_control[0x4f] = '\0';
  self->inmsg_control[0x30] = '\0';
  self->inmsg_control[0x31] = '\0';
  self->inmsg_control[0x32] = '\0';
  self->inmsg_control[0x33] = '\0';
  self->inmsg_control[0x34] = '\0';
  self->inmsg_control[0x35] = '\0';
  self->inmsg_control[0x36] = '\0';
  self->inmsg_control[0x37] = '\0';
  self->inmsg_control[0x38] = '\0';
  self->inmsg_control[0x39] = '\0';
  self->inmsg_control[0x3a] = '\0';
  self->inmsg_control[0x3b] = '\0';
  self->inmsg_control[0x3c] = '\0';
  self->inmsg_control[0x3d] = '\0';
  self->inmsg_control[0x3e] = '\0';
  self->inmsg_control[0x3f] = '\0';
  self->inmsg_control[0x20] = '\0';
  self->inmsg_control[0x21] = '\0';
  self->inmsg_control[0x22] = '\0';
  self->inmsg_control[0x23] = '\0';
  self->inmsg_control[0x24] = '\0';
  self->inmsg_control[0x25] = '\0';
  self->inmsg_control[0x26] = '\0';
  self->inmsg_control[0x27] = '\0';
  self->inmsg_control[0x28] = '\0';
  self->inmsg_control[0x29] = '\0';
  self->inmsg_control[0x2a] = '\0';
  self->inmsg_control[0x2b] = '\0';
  self->inmsg_control[0x2c] = '\0';
  self->inmsg_control[0x2d] = '\0';
  self->inmsg_control[0x2e] = '\0';
  self->inmsg_control[0x2f] = '\0';
  self->inmsg_control[0x10] = '\0';
  self->inmsg_control[0x11] = '\0';
  self->inmsg_control[0x12] = '\0';
  self->inmsg_control[0x13] = '\0';
  self->inmsg_control[0x14] = '\0';
  self->inmsg_control[0x15] = '\0';
  self->inmsg_control[0x16] = '\0';
  self->inmsg_control[0x17] = '\0';
  self->inmsg_control[0x18] = '\0';
  self->inmsg_control[0x19] = '\0';
  self->inmsg_control[0x1a] = '\0';
  self->inmsg_control[0x1b] = '\0';
  self->inmsg_control[0x1c] = '\0';
  self->inmsg_control[0x1d] = '\0';
  self->inmsg_control[0x1e] = '\0';
  self->inmsg_control[0x1f] = '\0';
  self->inmsg_control[0] = '\0';
  self->inmsg_control[1] = '\0';
  self->inmsg_control[2] = '\0';
  self->inmsg_control[3] = '\0';
  self->inmsg_control[4] = '\0';
  self->inmsg_control[5] = '\0';
  self->inmsg_control[6] = '\0';
  self->inmsg_control[7] = '\0';
  self->inmsg_control[8] = '\0';
  self->inmsg_control[9] = '\0';
  self->inmsg_control[10] = '\0';
  self->inmsg_control[0xb] = '\0';
  self->inmsg_control[0xc] = '\0';
  self->inmsg_control[0xd] = '\0';
  self->inmsg_control[0xe] = '\0';
  self->inmsg_control[0xf] = '\0';
  self->inhdr[0] = '\0';
  self->inhdr[1] = '\0';
  self->inhdr[2] = '\0';
  self->inhdr[3] = '\0';
  self->inhdr[4] = '\0';
  self->inhdr[5] = '\0';
  self->inhdr[6] = '\0';
  self->inhdr[7] = '\0';
  self->inhdr[6] = '\0';
  self->inhdr[7] = '\0';
  self->inhdr[8] = '\0';
  self->inhdr[9] = '\0';
  self->inhdr[10] = '\0';
  self->inhdr[0xb] = '\0';
  self->inhdr[0xc] = '\0';
  self->inhdr[0xd] = '\0';
  self->instate = 1;
  nn_usock_recv(self->usock,self->inhdr,2,(int *)0x0);
  return extraout_EAX;
}

Assistant:

static int nn_sws_recv_hdr (struct nn_sws *self)
{
    if (!self->continuing) {
        nn_assert (nn_list_empty (&self->inmsg_array));

        self->inmsg_current_chunk_buf = NULL;
        self->inmsg_chunks = 0;
        self->inmsg_current_chunk_len = 0;
        self->inmsg_total_size = 0;
    }

    memset (self->inmsg_control, 0, NN_SWS_PAYLOAD_MAX_LENGTH);
    memset (self->inhdr, 0, NN_SWS_FRAME_MAX_HDR_LEN);
    self->instate = NN_SWS_INSTATE_RECV_HDR;
    nn_usock_recv (self->usock, self->inhdr, NN_SWS_FRAME_SIZE_INITIAL, NULL);

    return 0;
}